

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

int get_constraint_priority(TCGOpDef *def,int k)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = def->args_ct[k].ct;
  if (-1 < (char)uVar1) {
    iVar2 = 0;
    if ((uVar1 & 1) != 0) {
      iVar2 = 0;
      for (uVar3 = 0; uVar3 != 0x20; uVar3 = uVar3 + 1) {
        iVar2 = iVar2 + (uint)((def->args_ct[k].u.regs >> (uVar3 & 0x1f) & 1) != 0);
      }
      iVar2 = 0x21 - iVar2;
    }
    return iVar2;
  }
  return 0x20;
}

Assistant:

static int get_constraint_priority(const TCGOpDef *def, int k)
{
    const TCGArgConstraint *arg_ct;

    int i, n;
    arg_ct = &def->args_ct[k];
    if (arg_ct->ct & TCG_CT_ALIAS) {
        /* an alias is equivalent to a single register */
        n = 1;
    } else {
        if (!(arg_ct->ct & TCG_CT_REG))
            return 0;
        n = 0;
        for(i = 0; i < TCG_TARGET_NB_REGS; i++) {
            if (tcg_regset_test_reg(arg_ct->u.regs, i))
                n++;
        }
    }
    return TCG_TARGET_NB_REGS - n + 1;
}